

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

string * __thiscall
pbrt::SampledLight::ToString_abi_cxx11_(string *__return_storage_ptr__,SampledLight *this)

{
  float *in_R8;
  long lVar1;
  char *local_48;
  string local_40;
  
  lVar1 = (this->light).
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits << 0x10;
  if (lVar1 == 0) {
    local_40._M_dataplus._M_p = "(nullptr)";
  }
  else {
    LightHandle::ToString_abi_cxx11_(&local_40,&this->light);
  }
  local_48 = local_40._M_dataplus._M_p;
  StringPrintf<char_const*,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ SampledLight light: %s pdf: %f ]",(char *)&local_48,
             (char **)&this->pdf,in_R8);
  if (lVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SampledLight::ToString() const {
    return StringPrintf("[ SampledLight light: %s pdf: %f ]",
                        light ? light.ToString().c_str() : "(nullptr)", pdf);
}